

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O0

Result __thiscall tonk::SessionOutgoing::PostRecovery(SessionOutgoing *this,int *bytesSentOut)

{
  Channel *pCVar1;
  IUDPSender *pIVar2;
  bool bVar3;
  uint16_t uVar4;
  uint32_t data;
  char *pcVar5;
  uint8_t *puVar6;
  uint64_t uVar7;
  ulong uVar8;
  uint *in_RDX;
  SessionOutgoing *in_RSI;
  ErrorResult *in_RDI;
  bool kNotReliable;
  uint kCompressionSavings;
  uint32_t timestamp24;
  uint64_t nowUsec;
  DatagramBuffer datagramBuffer;
  uint sendBytes;
  uint8_t *tagData;
  uint16_t tag;
  uint8_t *timestampData;
  uint taggedBytes;
  uint64_t a;
  uint32_t b;
  NonceT nonce;
  uint nonceBytes;
  uint8_t flags;
  uint8_t *footer;
  uint messageBytes;
  uint8_t *datagramData;
  OutgoingQueuedDatagram *datagram;
  int encodeResult;
  SiameseRecoveryPacket recovery;
  Locker locker;
  LogStringBuffer buffer;
  Lock *in_stack_fffffffffffffaf8;
  LogStringBuffer *in_stack_fffffffffffffb00;
  SiameseEncoder in_stack_fffffffffffffb08;
  ErrorType type;
  string *in_stack_fffffffffffffb10;
  uint bytes;
  uint8_t *in_stack_fffffffffffffb18;
  SimpleCipher *this_00;
  ErrorResult *in_stack_fffffffffffffb20;
  SenderBandwidthControl *pSVar9;
  undefined4 in_stack_fffffffffffffb38;
  uint in_stack_fffffffffffffb3c;
  Allocator *in_stack_fffffffffffffb40;
  uint64_t in_stack_fffffffffffffb48;
  ErrorResult *pEVar10;
  undefined8 in_stack_fffffffffffffb50;
  uint bytes_00;
  uint8_t *in_stack_fffffffffffffb58;
  allocator *paVar11;
  SimpleCipher *in_stack_fffffffffffffb60;
  DatagramBuffer local_420;
  uint local_3fc;
  ushort *local_3f8;
  uint16_t local_3ea;
  uint8_t *local_3e8;
  int local_3dc;
  undefined8 local_3d8;
  undefined4 local_3cc;
  NonceT local_3c8;
  uint local_3c0;
  byte local_3b9;
  ushort *local_3b8;
  uint local_3ac;
  uint8_t *local_3a8;
  uint8_t *local_3a0;
  allocator local_381;
  string local_380 [36];
  SiameseResult local_35c;
  uint local_358;
  void *local_350;
  uint *local_348;
  int local_314;
  OutgoingQueueCommon *local_310;
  long local_2f8;
  undefined4 local_2ec;
  string *local_2e8;
  char *local_2e0;
  uint8_t *local_2d0;
  uint8_t *local_2c8;
  undefined8 local_2c0;
  uint8_t *local_2b8;
  undefined4 local_2ac;
  uint8_t *local_2a8;
  uint32_t local_29c;
  uint8_t *local_298;
  undefined2 local_28a;
  uint8_t *local_288;
  ushort local_27a;
  ushort *local_278;
  byte local_269;
  uint local_268;
  int local_264;
  SenderBandwidthControl *local_260;
  char *local_258;
  Channel *local_250;
  char *local_248;
  undefined4 local_23c;
  Channel *local_238;
  undefined4 local_22c;
  Channel *local_228;
  undefined1 local_210 [16];
  ostream aoStack_200 [376];
  char *local_88;
  undefined4 local_7c;
  Channel *local_78;
  char *local_70;
  string *local_68;
  undefined1 *local_60;
  Channel *local_58;
  string *local_50;
  undefined1 *local_48;
  Channel *local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  Channel *local_18;
  char *local_10;
  undefined1 *local_8;
  
  bytes_00 = (uint)((ulong)in_stack_fffffffffffffb50 >> 0x20);
  *in_RDX = 0;
  local_348 = in_RDX;
  bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffb08);
  if (bVar3) {
    local_35c = siamese_encode(in_stack_fffffffffffffb08,
                               (SiameseRecoveryPacket *)in_stack_fffffffffffffb00);
    if (local_35c == Siamese_NeedMoreData) {
      Result::Success();
    }
    else if (local_35c == Siamese_Success) {
      local_310 = &in_RSI->super_OutgoingQueueCommon;
      local_314 = local_358 + 0x30;
      Locker::Locker((Locker *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      bytes = (uint)((ulong)in_stack_fffffffffffffb10 >> 0x20);
      puVar6 = pktalloc::Allocator::Allocate(in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c);
      Locker::~Locker((Locker *)0x176818);
      local_3a0 = puVar6;
      if (puVar6 == (uint8_t *)0x0) {
        Result::OutOfMemory();
      }
      else {
        local_3a8 = puVar6 + 0x10;
        local_3ac = local_358;
        memcpy(local_3a8,local_350,(ulong)local_358);
        local_3b8 = (ushort *)(local_3a8 + local_3ac);
        local_3b9 = 0x90;
        if ((in_RSI->ShouldCompressSequenceNumbers & 1U) != 0) {
          local_3b9 = 0xb0;
        }
        local_3c8 = writeNonce(in_RSI,(uint8_t *)local_3b8,&local_3c0);
        local_3b9 = local_3b9 | (byte)(local_3c0 << 2);
        local_3b8 = (ushort *)((long)local_3b8 + (ulong)local_3c0);
        bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffb08);
        if (bVar3) {
          local_3b9 = local_3b9 | 0x40;
          local_2d0 = in_RSI->Handshake + 8;
          local_3cc = *(undefined4 *)local_2d0;
          local_2c8 = in_RSI->Handshake;
          local_3d8 = *(undefined8 *)local_2c8;
          local_2b8 = (uint8_t *)local_3b8;
          *(undefined8 *)local_3b8 = local_3d8;
          local_2a8 = (uint8_t *)((long)local_3b8 + 8);
          *(undefined4 *)local_2a8 = local_3cc;
          local_3b8 = (ushort *)((long)local_3b8 + 0xc);
          local_2c0 = local_3d8;
          local_2ac = local_3cc;
        }
        local_3dc = (int)local_3b8 - (int)local_3a8;
        local_3e8 = (uint8_t *)local_3b8;
        *(byte *)((long)local_3b8 + 3) = local_3b9;
        local_3b8 = (ushort *)((long)local_3b8 + 4);
        security::SimpleCipher::Cipher
                  (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,bytes_00,
                   in_stack_fffffffffffffb48);
        local_3ea = security::SimpleCipher::Tag
                              ((SimpleCipher *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
                               bytes,(uint64_t)in_stack_fffffffffffffb08);
        local_3f8 = local_3b8;
        local_3fc = local_3dc + 6;
        DatagramBuffer::DatagramBuffer(&local_420);
        local_420.AllocatorForFree = &(in_RSI->super_OutgoingQueueCommon).WriteAllocator;
        local_420.Data = local_3a8;
        local_420.FreePtr = local_3a0;
        local_420.Bytes = local_3fc;
        uVar7 = siamese::GetTimeUsec();
        uVar8 = uVar7 >> 3;
        this_00 = &in_RSI->Encryptor;
        data = protocol::TimestampFlagTagInt((uint32_t)uVar8,local_3b9);
        uVar4 = security::SimpleCipher::TagInt(this_00,data);
        local_3ea = local_3ea ^ uVar4;
        local_298 = local_3e8;
        local_3e8[2] = (uint8_t)(uVar8 >> 0x10);
        local_288 = local_3e8;
        local_28a = (undefined2)uVar8;
        *(undefined2 *)local_3e8 = local_28a;
        local_278 = local_3f8;
        *local_3f8 = local_3ea;
        pIVar2 = (in_RSI->Deps).UDPSender;
        local_29c = (uint32_t)uVar8;
        local_27a = local_3ea;
        (*pIVar2->_vptr_IUDPSender[2])(pIVar2,&in_RSI->PeerUDPAddress,(in_RSI->Deps).ConnectionRef);
        pSVar9 = (in_RSI->Deps).SenderControl;
        local_264 = 0;
        local_268 = local_3fc;
        local_269 = 0;
        local_260 = pSVar9;
        std::__atomic_base<int>::operator-=
                  (&(pSVar9->AvailableTokens).super___atomic_base<int>,local_3fc);
        if ((local_269 & 1) != 0) {
          pSVar9->RecoverySendTokens = pSVar9->RecoverySendTokens + 0x400;
        }
        pSVar9->ProbeSendTokens = local_268 + local_264 + pSVar9->ProbeSendTokens;
        *local_348 = local_3fc;
        Result::Success();
      }
    }
    else {
      paVar11 = &local_381;
      std::allocator<char>::allocator();
      type = (ErrorType)((ulong)in_stack_fffffffffffffb08 >> 0x20);
      std::__cxx11::string::string(local_380,"siamese_encode failed",paVar11);
      local_2f8 = (long)(int)local_35c;
      local_2e0 = "SessionOutgoing::PostRecovery";
      local_2e8 = local_380;
      local_2ec = 1;
      pEVar10 = in_RDI;
      pcVar5 = (char *)operator_new(0x38);
      ErrorResult::ErrorResult
                (in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18,
                 in_stack_fffffffffffffb10,type,(ErrorCodeT)in_stack_fffffffffffffb00);
      pEVar10->Source = pcVar5;
      std::__cxx11::string::~string(local_380);
      std::allocator<char>::~allocator((allocator<char> *)&local_381);
    }
  }
  else {
    pCVar1 = (in_RSI->Deps).Logger;
    local_258 = "PostRecovery ignored before peer address is known";
    local_23c = 3;
    local_248 = "PostRecovery ignored before peer address is known";
    local_22c = 3;
    local_250 = pCVar1;
    local_238 = pCVar1;
    local_228 = pCVar1;
    if ((int)pCVar1->ChannelMinLevel < 4) {
      local_7c = 3;
      local_88 = "PostRecovery ignored before peer address is known";
      local_78 = pCVar1;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffffb00,(char *)in_stack_fffffffffffffaf8,Trace);
      local_68 = &pCVar1->Prefix;
      local_70 = local_88;
      local_60 = local_210;
      local_58 = pCVar1;
      local_50 = local_68;
      local_48 = local_210;
      local_40 = pCVar1;
      local_38 = local_68;
      local_30 = local_210;
      std::operator<<(aoStack_200,(string *)local_68);
      local_20 = local_60;
      local_28 = local_70;
      local_8 = local_60;
      local_10 = local_70;
      local_18 = pCVar1;
      std::operator<<((ostream *)(local_60 + 0x10),local_70);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write
                ((OutputWorker *)in_stack_fffffffffffffb40,
                 (LogStringBuffer *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x17659d);
    }
    Result::Success();
  }
  return (Result)in_RDI;
}

Assistant:

Result SessionOutgoing::PostRecovery(int& bytesSentOut)
{
    bytesSentOut = 0;

    if (!HasPeerAddress)
    {
        Deps.Logger->Warning("PostRecovery ignored before peer address is known");
        return Result::Success();
    }

    // Generate a recovery packet using the Siamese FEC library.
    // The recovery data is only valid until the next call to siamese_encode()
    SiameseRecoveryPacket recovery;
    const int encodeResult = siamese_encode(FECEncoder, &recovery);

    if (encodeResult == Siamese_NeedMoreData) {
        return Result::Success();
    }

    if (encodeResult != Siamese_Success) {
        return Result("SessionOutgoing::PostRecovery", "siamese_encode failed", ErrorType::Siamese, encodeResult);
    }

    // Allocate space for queued datagram
    OutgoingQueuedDatagram* datagram = (OutgoingQueuedDatagram*)WriteAllocator.Allocate(
        kQueueHeaderBytes + recovery.DataBytes + protocol::kMaxOverheadBytes);
    if (!datagram) {
        return Result::OutOfMemory();
    }

    // No need to call Initialize on the OutgoingQueuedDatagram object

    uint8_t* datagramData = datagram->Data;
    unsigned messageBytes = recovery.DataBytes;

    /*
        This memory allocation and copy cannot be trivially eliminated.
        Hopefully it won't show up on a CPU profiler.

        I started working on it in the Siamese scratch-space branch.
        The problem is that the send timer does not tick fast enough to keep up
        with data rates above 1 MB/s, assuming that Asio completes one send per
        tick.  Tonk must queue up multiple FEC Recovery Datagrams per tick.
    */
    memcpy(datagramData, recovery.Data, messageBytes);

    // The following code must be kept in sync with sendQueuedDatagram().
    // It is inlined and optimized for this common case:

    // No random padding

    uint8_t* footer = datagramData + messageBytes;
    uint8_t flags = protocol::kOnlyFECMask | protocol::kConnectionMask;
    if (ShouldCompressSequenceNumbers) {
        flags |= protocol::kSeqCompMask;
    }

    // No reliable sequence number

    // Write packet nonce to header
    unsigned nonceBytes;
    NonceT nonce = writeNonce(footer, nonceBytes);
    flags |= nonceBytes << 2;
    footer += nonceBytes;

    if (ShouldAttachHandshake)
    {
        flags |= protocol::kHandshakeMask;
        const uint32_t b = siamese::ReadU32_LE(Handshake + 8);
        const uint64_t a = siamese::ReadU64_LE(Handshake);
        siamese::WriteU64_LE(footer, a);
        siamese::WriteU32_LE(footer + 8, b);
        footer += protocol::kHandshakeBytes;
    }

    // Tag checksum includes all the data before the timestamp
    const unsigned taggedBytes = (unsigned)(footer - datagramData);

    // Skip over the timestamp
    uint8_t* timestampData = footer;
    footer += protocol::kTimestampBytes;

    // Write flags
    footer[0] = flags;
    ++footer;

    Encryptor.Cipher(datagramData, messageBytes, nonce);

    // Prepare tag
    uint16_t tag = Encryptor.Tag(datagramData, taggedBytes, nonce);
    static_assert(protocol::kEncryptionTagBytes == 2, "Update this if that changes");
    uint8_t* tagData = footer;

    const unsigned sendBytes = taggedBytes + protocol::kUntaggedDatagramBytes;

    DatagramBuffer datagramBuffer;
    datagramBuffer.AllocatorForFree = &WriteAllocator;
    datagramBuffer.Data = datagramData;
    datagramBuffer.FreePtr = datagram;
    datagramBuffer.Bytes = sendBytes;

    TONK_DEBUG_ASSERT(Deps.UDPSender != nullptr);
    TONK_DEBUG_ASSERT(HasPeerAddress);

#ifdef TONK_DETAILED_STATS
    DetailStats* stats = Deps.Deets->GetWritePtr();
    stats->Stats[Stats_SiameseBytesSent] += messageBytes; // Flags bit means no message frame header
    stats->Stats[Stats_FootersBytesSent] += sendBytes - messageBytes;
#endif // TONK_DETAILED_STATS

    // Write timestamp and final tag - Reduce noise in timestamp measurements
    const uint64_t nowUsec = siamese::GetTimeUsec();
    const uint32_t timestamp24 = (uint32_t)(nowUsec >> kTime23LostBits);
    tag ^= Encryptor.TagInt(protocol::TimestampFlagTagInt(timestamp24, flags));
    siamese::WriteU24_LE(timestampData, timestamp24);
    siamese::WriteU16_LE(tagData, tag);

    // Send the data
    Deps.UDPSender->Send(
        PeerUDPAddress,
        datagramBuffer,
        Deps.ConnectionRef);

    const unsigned kCompressionSavings = 0;
    const bool kNotReliable = false;

    // Update bandwidth control
    Deps.SenderControl->OnSendDatagram(
        kCompressionSavings,
        sendBytes,
        kNotReliable);

    // Report number of bytes sent
    bytesSentOut = static_cast<int>(sendBytes);

#ifdef TONK_ENABLE_VERBOSE_OUTGOING
    ++m_Recovery;
    Deps.Logger->Info("Recovery sent. Current send rate = ", (float)m_Recovery / (float)m_Reliable);
#endif // TONK_ENABLE_VERBOSE_OUTGOING

    return Result::Success();
}